

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O3

RunResult wabt::interp::IntDiv<int>(int lhs,int rhs,int *out,string *out_msg)

{
  char *pcVar1;
  
  if (rhs == 0) {
    pcVar1 = "integer divide by zero";
  }
  else {
    if (rhs != -1 || lhs != -0x80000000) {
      *out = lhs / rhs;
      return Ok;
    }
    pcVar1 = "integer overflow";
  }
  std::__cxx11::string::operator=((string *)out_msg,pcVar1);
  return Trap;
}

Assistant:

RunResult WABT_VECTORCALL IntDiv(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs / rhs;
    return RunResult::Ok;
  } else {
    *out_msg = "integer overflow";
    return RunResult::Trap;
  }
}